

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugger.cxx
# Opt level: O3

cmListFileContext * __thiscall
cmDebugger_impl::CurrentLine(cmListFileContext *__return_storage_ptr__,cmDebugger_impl *this)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->Name)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->Name).field_2
  ;
  pcVar1 = (this->currentLocation).Name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,
             pcVar1 + (this->currentLocation).Name._M_string_length);
  (__return_storage_ptr__->FilePath)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->FilePath).field_2;
  pcVar1 = (this->currentLocation).FilePath._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->FilePath,pcVar1,
             pcVar1 + (this->currentLocation).FilePath._M_string_length);
  __return_storage_ptr__->Line = (this->currentLocation).Line;
  return __return_storage_ptr__;
}

Assistant:

cmListFileContext CurrentLine() const override { return currentLocation; }